

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O1

void main_cold_1(void)

{
  fputs("j1939cat: netcat-like tool for j1939\nUsage: j1939cat [options] FROM TO\n FROM / TO\t- or [IFACE][:[SA][,[PGN][,NAME]]]\nOptions:\n -i <infile>\t(default stdin)\n -s <size>\tSet maximal transfer size. Default: 117440505 byte\n -r\t\tReceive data\n -P <timeout>  poll timeout in milliseconds before sending data.\n\t\tWith this option send() will be used with MSG_DONTWAIT flag.\n -R <count>\tSet send repeat count. Default: 1\n -B\t\tAllow to send and receive broadcast packets.\n\nExample:\nj1939cat -i some_file_to_send  can0:0x80 :0x90,0x12300\nj1939cat can0:0x90 -r > /tmp/some_file_to_receive\n\n"
        ,_stderr);
  return;
}

Assistant:

static int j1939cat_parse_args(struct j1939cat_priv *priv, int argc, char *argv[])
{
	int opt;

	/* argument parsing */
	while ((opt = getopt(argc, argv, optstring)) != -1)
		switch (opt) {
		case 'i':
			priv->infile = open(optarg, O_RDONLY);
			if (priv->infile == -1)
				err(EXIT_FAILURE, "can't open input file");
			priv->todo_filesize = 1;
			break;
		case 's':
			priv->max_transfer = strtoul(optarg, NULL, 0);
			if (priv->max_transfer > J1939_MAX_ETP_PACKET_SIZE)
				err(EXIT_FAILURE,
				    "used value (%zu) is bigger then allowed maximal size: %u.\n",
				    priv->max_transfer,
				    J1939_MAX_ETP_PACKET_SIZE);
			break;
		case 'r':
			priv->todo_recv = 1;
			break;
		case 'p':
			priv->todo_prio = strtoul(optarg, NULL, 0);
			break;
		case 'P':
			priv->polltimeout = strtoul(optarg, NULL, 0);
			break;
		case 'c':
			priv->todo_connect = 1;
			break;
		case 'R':
			priv->repeat = strtoul(optarg, NULL, 0);
			if (priv->repeat < 1)
				err(EXIT_FAILURE,
				    "send/repeat count can't be less then 1\n");
			break;
		case 'B':
			priv->todo_broadcast = 1;
			break;
		case 'h': /*fallthrough*/
		default:
			fputs(help_msg, stderr);
			return EXIT_FAILURE;
		}

	if (argv[optind]) {
		if (strcmp("-", argv[optind]) != 0)
			libj1939_parse_canaddr(argv[optind], &priv->sockname);
		optind++;
	}

	if (argv[optind]) {
		if (strcmp("-", argv[optind]) != 0) {
			libj1939_parse_canaddr(argv[optind], &priv->peername);
			priv->valid_peername = 1;
		}
		optind++;
	}

	return EXIT_SUCCESS;
}